

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O2

void __thiscall gjkepa2_impl::EPA::Initialize(EPA *this)

{
  long lVar1;
  
  this->m_status = Failed;
  this->m_nextsv = 0;
  (this->m_normal).m_floats[0] = 0.0;
  (this->m_normal).m_floats[1] = 0.0;
  (this->m_normal).m_floats[2] = 0.0;
  (this->m_normal).m_floats[3] = 0.0;
  this->m_depth = 0.0;
  for (lVar1 = 0x37f8; lVar1 != 0x7f8; lVar1 = lVar1 + -0x60) {
    append(&this->m_stock,(sFace *)((long)(this->m_result).c + lVar1 + -8));
  }
  return;
}

Assistant:

void				Initialize()
			{
				m_status	=	eStatus::Failed;
				m_normal	=	btVector3(0,0,0);
				m_depth		=	0;
				m_nextsv	=	0;
				for(U i=0;i<EPA_MAX_FACES;++i)
				{
					append(m_stock,&m_fc_store[EPA_MAX_FACES-i-1]);
				}
			}